

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O3

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar3;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  ulong uVar6;
  int in_R8D;
  sockaddr_in *addr_00;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client;
  uv_udp_t client2;
  uv_buf_t uStack_868;
  undefined1 auStack_856 [18];
  undefined8 uStack_844;
  undefined8 uStack_83c;
  undefined8 uStack_834;
  undefined8 uStack_82c;
  undefined8 uStack_824;
  undefined8 uStack_81c;
  undefined8 uStack_814;
  undefined8 uStack_80c;
  undefined8 uStack_804;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined8 uStack_7f0;
  undefined1 auStack_7e8 [536];
  uv_loop_t *puStack_5d0;
  code *pcStack_5c8;
  uv_buf_t uStack_5c0;
  sockaddr_in sStack_5b0;
  uv_udp_t uStack_5a0;
  uv_udp_t uStack_4c8;
  uv_loop_t *puStack_3f0;
  sockaddr_in sStack_3e0;
  uv_udp_t uStack_3d0;
  uv_loop_t *puStack_2f8;
  uv_udp_t uStack_2f0;
  uv_loop_t *puStack_218;
  undefined4 uStack_1e4;
  uv_loop_t *puStack_1e0;
  uv_buf_t local_1d8;
  sockaddr_in local_1c8;
  uv_udp_t local_1b8;
  uv_udp_t local_e0;
  
  puStack_1e0 = (uv_loop_t *)0x178849;
  local_1d8 = uv_buf_init("PING",4);
  puStack_1e0 = (uv_loop_t *)0x178868;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_1c8);
  if (iVar1 == 0) {
    puStack_1e0 = (uv_loop_t *)0x178875;
    uVar2 = create_udp_socket();
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_1e0 = (uv_loop_t *)0x17887c;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x178889;
    iVar1 = uv_udp_init(puVar4,&local_1b8);
    if (iVar1 != 0) goto LAB_001789bf;
    puStack_1e0 = (uv_loop_t *)0x17889d;
    iVar1 = uv_udp_open(&local_1b8,uVar2);
    if (iVar1 != 0) goto LAB_001789c4;
    puStack_1e0 = (uv_loop_t *)0x1788b6;
    iVar1 = uv_udp_bind(&local_1b8,(sockaddr *)&local_1c8,0);
    if (iVar1 != 0) goto LAB_001789c9;
    puStack_1e0 = (uv_loop_t *)0x1788d6;
    iVar1 = uv_udp_recv_start(&local_1b8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_001789ce;
    addr_00 = &local_1c8;
    in_RCX = (undefined4 *)0x1;
    puStack_1e0 = (uv_loop_t *)0x178903;
    iVar1 = uv_udp_send(&send_req,&local_1b8,&local_1d8,1,(sockaddr *)addr_00,send_cb);
    in_R8D = (int)addr_00;
    if (iVar1 != 0) goto LAB_001789d3;
    puStack_1e0 = (uv_loop_t *)0x178910;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x178920;
    iVar1 = uv_udp_init(puVar4,&local_e0);
    if (iVar1 != 0) goto LAB_001789d8;
    puStack_1e0 = (uv_loop_t *)0x178937;
    iVar1 = uv_udp_open(&local_e0,uVar2);
    if (iVar1 != -0x11) goto LAB_001789dd;
    puStack_1e0 = (uv_loop_t *)0x17894f;
    uv_close((uv_handle_t *)&local_e0,(uv_close_cb)0x0);
    puStack_1e0 = (uv_loop_t *)0x178954;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x17895e;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_001789e2;
    if (close_cb_called != 1) goto LAB_001789e7;
    if (local_1b8.send_queue_size != 0) goto LAB_001789ec;
    puStack_1e0 = (uv_loop_t *)0x178980;
    unaff_RBX = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x178994;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_1e0 = (uv_loop_t *)0x17899e;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_1e0 = (uv_loop_t *)0x1789a3;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x1789ab;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_1e0 = (uv_loop_t *)0x1789bf;
    run_test_udp_open_cold_1();
LAB_001789bf:
    puStack_1e0 = (uv_loop_t *)0x1789c4;
    run_test_udp_open_cold_2();
LAB_001789c4:
    puStack_1e0 = (uv_loop_t *)0x1789c9;
    run_test_udp_open_cold_3();
LAB_001789c9:
    puStack_1e0 = (uv_loop_t *)0x1789ce;
    run_test_udp_open_cold_4();
LAB_001789ce:
    puStack_1e0 = (uv_loop_t *)0x1789d3;
    run_test_udp_open_cold_5();
LAB_001789d3:
    puStack_1e0 = (uv_loop_t *)0x1789d8;
    run_test_udp_open_cold_6();
LAB_001789d8:
    puStack_1e0 = (uv_loop_t *)0x1789dd;
    run_test_udp_open_cold_7();
LAB_001789dd:
    puStack_1e0 = (uv_loop_t *)0x1789e2;
    run_test_udp_open_cold_8();
LAB_001789e2:
    puStack_1e0 = (uv_loop_t *)0x1789e7;
    run_test_udp_open_cold_9();
LAB_001789e7:
    puStack_1e0 = (uv_loop_t *)0x1789ec;
    run_test_udp_open_cold_10();
LAB_001789ec:
    puStack_1e0 = (uv_loop_t *)0x1789f1;
    run_test_udp_open_cold_11();
  }
  puStack_1e0 = (uv_loop_t *)create_udp_socket;
  run_test_udp_open_cold_12();
  puVar4 = (uv_loop_t *)0x2;
  uVar6 = 2;
  puStack_1e0 = unaff_RBX;
  uVar2 = socket(2,2,0);
  if ((int)uVar2 < 0) {
    create_udp_socket_cold_1();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    in_RCX = &uStack_1e4;
    uStack_1e4 = 1;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    uVar6 = 1;
    in_R8D = 4;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    if (iVar1 == 0) {
      return uVar2;
    }
  }
  create_udp_socket_cold_2();
  if (uVar6 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x5713f0;
  }
  alloc_cb_cold_1();
  if ((long)uVar6 < 0) {
    recv_cb_cold_7();
    puVar5 = puVar4;
LAB_00178ab7:
    recv_cb_cold_1();
LAB_00178abc:
    recv_cb_cold_5();
LAB_00178ac1:
    recv_cb_cold_2();
LAB_00178ac6:
    recv_cb_cold_3();
LAB_00178acb:
    recv_cb_cold_4();
    puVar4 = puVar5;
  }
  else {
    if (uVar6 != 0) {
      puVar5 = puVar4;
      if (in_R8D != 0) goto LAB_00178ab7;
      if (in_RCX == (undefined4 *)0x0) goto LAB_00178abc;
      if (uVar6 != 4) goto LAB_00178ac1;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_00178ac6;
      iVar1 = uv_udp_recv_stop((uv_udp_t *)puVar4);
      unaff_RBX = puVar4;
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)puVar4,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_00178acb;
    }
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)uVar6;
  recv_cb_cold_6();
  if (puVar4 == (uv_loop_t *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close(*(uv_handle_t **)&puVar4->backend_fd,close_cb);
    return extraout_EAX_01;
  }
  send_cb_cold_1();
  puStack_2f8 = (uv_loop_t *)0x178b0e;
  puStack_218 = unaff_RBX;
  uVar2 = create_udp_socket();
  puStack_2f8 = (uv_loop_t *)0x178b15;
  uVar3 = create_udp_socket();
  puVar5 = (uv_loop_t *)(ulong)uVar3;
  puStack_2f8 = (uv_loop_t *)0x178b1c;
  puVar4 = uv_default_loop();
  puStack_2f8 = (uv_loop_t *)0x178b27;
  iVar1 = uv_udp_init(puVar4,&uStack_2f0);
  if (iVar1 == 0) {
    puStack_2f8 = (uv_loop_t *)0x178b39;
    iVar1 = uv_udp_open(&uStack_2f0,uVar2);
    if (iVar1 != 0) goto LAB_00178bb5;
    puStack_2f8 = (uv_loop_t *)0x178b47;
    iVar1 = uv_udp_open(&uStack_2f0,uVar3);
    if (iVar1 != -0x10) goto LAB_00178bba;
    puStack_2f8 = (uv_loop_t *)0x178b53;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00178bbf;
    puStack_2f8 = (uv_loop_t *)0x178b61;
    uv_close((uv_handle_t *)&uStack_2f0,(uv_close_cb)0x0);
    puStack_2f8 = (uv_loop_t *)0x178b66;
    puVar4 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x178b70;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_2f8 = (uv_loop_t *)0x178b75;
    puVar5 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x178b89;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_2f8 = (uv_loop_t *)0x178b93;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_2f8 = (uv_loop_t *)0x178b98;
    puVar4 = uv_default_loop();
    puStack_2f8 = (uv_loop_t *)0x178ba0;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_2f8 = (uv_loop_t *)0x178bb5;
    run_test_udp_open_twice_cold_1();
LAB_00178bb5:
    puStack_2f8 = (uv_loop_t *)0x178bba;
    run_test_udp_open_twice_cold_2();
LAB_00178bba:
    puStack_2f8 = (uv_loop_t *)0x178bbf;
    run_test_udp_open_twice_cold_3();
LAB_00178bbf:
    puStack_2f8 = (uv_loop_t *)0x178bc4;
    run_test_udp_open_twice_cold_4();
  }
  puStack_2f8 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_3f0 = (uv_loop_t *)0x178be7;
  puStack_2f8 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3e0);
  if (iVar1 == 0) {
    puStack_3f0 = (uv_loop_t *)0x178bf4;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    puStack_3f0 = (uv_loop_t *)0x178c07;
    iVar1 = bind(uVar3,(sockaddr *)&sStack_3e0,0x10);
    if (iVar1 != 0) goto LAB_00178cb8;
    puStack_3f0 = (uv_loop_t *)0x178c14;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178c21;
    iVar1 = uv_udp_init(puVar4,&uStack_3d0);
    if (iVar1 != 0) goto LAB_00178cbd;
    puStack_3f0 = (uv_loop_t *)0x178c35;
    iVar1 = uv_udp_open(&uStack_3d0,uVar3);
    if (iVar1 != 0) goto LAB_00178cc2;
    puStack_3f0 = (uv_loop_t *)0x178c55;
    iVar1 = uv_udp_recv_start(&uStack_3d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178cc7;
    puStack_3f0 = (uv_loop_t *)0x178c65;
    uv_close((uv_handle_t *)&uStack_3d0,(uv_close_cb)0x0);
    puStack_3f0 = (uv_loop_t *)0x178c6a;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178c74;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_3f0 = (uv_loop_t *)0x178c79;
    puVar5 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178c8d;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_3f0 = (uv_loop_t *)0x178c97;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_3f0 = (uv_loop_t *)0x178c9c;
    puVar4 = uv_default_loop();
    puStack_3f0 = (uv_loop_t *)0x178ca4;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_3f0 = (uv_loop_t *)0x178cb8;
    run_test_udp_open_bound_cold_1();
LAB_00178cb8:
    puStack_3f0 = (uv_loop_t *)0x178cbd;
    run_test_udp_open_bound_cold_2();
LAB_00178cbd:
    puStack_3f0 = (uv_loop_t *)0x178cc2;
    run_test_udp_open_bound_cold_3();
LAB_00178cc2:
    puStack_3f0 = (uv_loop_t *)0x178cc7;
    run_test_udp_open_bound_cold_4();
LAB_00178cc7:
    puStack_3f0 = (uv_loop_t *)0x178ccc;
    run_test_udp_open_bound_cold_5();
  }
  puStack_3f0 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_5c8 = (code *)0x178cea;
  puStack_3f0 = puVar5;
  uStack_5c0 = uv_buf_init("PING",4);
  pcStack_5c8 = (code *)0x178d09;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    pcStack_5c8 = (code *)0x178d16;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    pcStack_5c8 = (code *)0x178d1d;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178d2a;
    iVar1 = uv_udp_init(puVar4,&uStack_5a0);
    if (iVar1 != 0) goto LAB_00178e56;
    pcStack_5c8 = (code *)0x178d43;
    iVar1 = connect(uVar3,(sockaddr *)&sStack_5b0,0x10);
    if (iVar1 != 0) goto LAB_00178e5b;
    pcStack_5c8 = (code *)0x178d57;
    iVar1 = uv_udp_open(&uStack_5a0,uVar3);
    if (iVar1 != 0) goto LAB_00178e60;
    pcStack_5c8 = (code *)0x178d64;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178d74;
    iVar1 = uv_udp_init(puVar4,&uStack_4c8);
    if (iVar1 != 0) goto LAB_00178e65;
    pcStack_5c8 = (code *)0x178d90;
    iVar1 = uv_udp_bind(&uStack_4c8,(sockaddr *)&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_00178e6a;
    pcStack_5c8 = (code *)0x178db3;
    iVar1 = uv_udp_recv_start(&uStack_4c8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178e6f;
    pcStack_5c8 = (code *)0x178dde;
    iVar1 = uv_udp_send(&send_req,&uStack_5a0,&uStack_5c0,1,(sockaddr *)0x0,send_cb);
    if (iVar1 != 0) goto LAB_00178e74;
    pcStack_5c8 = (code *)0x178deb;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178df5;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00178e79;
    if (close_cb_called != 2) goto LAB_00178e7e;
    if ((void *)uStack_5a0.send_queue_size != (void *)0x0) goto LAB_00178e83;
    pcStack_5c8 = (code *)0x178e17;
    puVar5 = uv_default_loop();
    pcStack_5c8 = (code *)0x178e2b;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStack_5c8 = (code *)0x178e35;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_5c8 = (code *)0x178e3a;
    puVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x178e42;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_5c8 = (code *)0x178e56;
    run_test_udp_open_connect_cold_1();
LAB_00178e56:
    pcStack_5c8 = (code *)0x178e5b;
    run_test_udp_open_connect_cold_2();
LAB_00178e5b:
    pcStack_5c8 = (code *)0x178e60;
    run_test_udp_open_connect_cold_3();
LAB_00178e60:
    pcStack_5c8 = (code *)0x178e65;
    run_test_udp_open_connect_cold_4();
LAB_00178e65:
    pcStack_5c8 = (code *)0x178e6a;
    run_test_udp_open_connect_cold_5();
LAB_00178e6a:
    pcStack_5c8 = (code *)0x178e6f;
    run_test_udp_open_connect_cold_6();
LAB_00178e6f:
    pcStack_5c8 = (code *)0x178e74;
    run_test_udp_open_connect_cold_7();
LAB_00178e74:
    pcStack_5c8 = (code *)0x178e79;
    run_test_udp_open_connect_cold_8();
LAB_00178e79:
    pcStack_5c8 = (code *)0x178e7e;
    run_test_udp_open_connect_cold_9();
LAB_00178e7e:
    pcStack_5c8 = (code *)0x178e83;
    run_test_udp_open_connect_cold_10();
LAB_00178e83:
    pcStack_5c8 = (code *)0x178e88;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_5c8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  puStack_5d0 = puVar5;
  pcStack_5c8 = (code *)(ulong)uVar2;
  uStack_868 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_83c = 0;
  uStack_834 = 0;
  uStack_82c = 0;
  uStack_824 = 0;
  uStack_81c = 0;
  uStack_814 = 0;
  uStack_80c = 0;
  uStack_804 = 0;
  uStack_7fc = 0;
  uStack_7f8 = 0;
  uStack_7f4 = 0;
  uStack_7f0 = 0;
  auStack_856._0_2_ = 1;
  auStack_856[2] = '/';
  auStack_856[3] = 't';
  auStack_856[4] = 'm';
  auStack_856[5] = 'p';
  auStack_856[6] = '/';
  auStack_856[7] = 'u';
  auStack_856[8] = 'v';
  auStack_856[9] = '-';
  auStack_856[10] = 't';
  auStack_856[0xb] = 'e';
  auStack_856[0xc] = 's';
  auStack_856[0xd] = 't';
  auStack_856[0xe] = '-';
  auStack_856[0xf] = 's';
  auStack_856[0x10] = 'o';
  auStack_856[0x11] = 'c';
  uStack_844 = 0x6b;
  puVar4 = (uv_loop_t *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017901c:
    run_test_udp_send_unix_cold_2();
LAB_00179021:
    run_test_udp_send_unix_cold_3();
LAB_00179026:
    run_test_udp_send_unix_cold_4();
LAB_0017902b:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = bind(uVar2,(sockaddr *)auStack_856,0x6e);
    if (iVar1 != 0) goto LAB_0017901c;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00179021;
    puVar4 = puVar5;
    iVar1 = uv_udp_init(puVar5,(uv_udp_t *)auStack_7e8);
    if (iVar1 != 0) goto LAB_00179026;
    puVar4 = (uv_loop_t *)auStack_7e8;
    iVar1 = uv_udp_open((uv_udp_t *)puVar4,uVar2);
    if (iVar1 != 0) goto LAB_0017902b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = (uv_loop_t *)(auStack_7e8 + 0xd8);
    iVar1 = uv_udp_send((uv_udp_send_t *)puVar4,(uv_udp_t *)auStack_7e8,&uStack_868,1,
                        (sockaddr *)auStack_856,(uv_udp_send_cb)0x0);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)auStack_7e8,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00179035;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00179035:
  run_test_udp_send_unix_cold_7();
  if (puVar4 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_02;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    uv_udp_t client2;

    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#endif  /* !_WIN32 */

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}